

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall Printer_printReset_Test::~Printer_printReset_Test(Printer_printReset_Test *this)

{
  Printer_printReset_Test *this_local;
  
  ~Printer_printReset_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Printer, printReset)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model\">\n"
        "  <component name=\"component\">\n"
        "    <variable name=\"variable1\"/>\n"
        "    <variable name=\"variable2\"/>\n"
        "    <reset variable=\"variable1\" test_variable=\"variable2\" order=\"1\">\n"
        "      <test_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\"/>\n"
        "      </test_value>\n"
        "      <reset_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\"/>\n"
        "      </reset_value>\n"
        "    </reset>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ModelPtr m = createModelWithComponent("model", "component");
    libcellml::ComponentPtr c = m->component(0);
    libcellml::VariablePtr v1 = libcellml::Variable::create("variable1");
    libcellml::VariablePtr v2 = libcellml::Variable::create("variable2");
    libcellml::ResetPtr r = libcellml::Reset::create();

    r->setVariable(v1);
    r->setTestVariable(v2);
    r->setOrder(1);
    r->setResetValue(EMPTY_MATH);
    r->setTestValue(EMPTY_MATH);

    c->addVariable(v1);
    c->addVariable(v2);
    c->addReset(r);

    libcellml::PrinterPtr printer = libcellml::Printer::create();

    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}